

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ezexample.h
# Opt level: O2

void __thiscall ezexample::finish(ezexample *this)

{
  example **ppeVar1;
  int iVar2;
  example **ppeVar3;
  
  if (finish()::empty_example == '\0') {
    iVar2 = __cxa_guard_acquire(&finish()::empty_example);
    if (iVar2 != 0) {
      if (this->is_multiline == true) {
        finish::empty_example = VW::read_example(this->vw_par_ref,"");
      }
      else {
        finish::empty_example = (example *)0x0;
      }
      __cxa_guard_release(&finish()::empty_example);
    }
  }
  if (this->is_multiline == true) {
    vw::learn(this->vw_ref,finish::empty_example);
    ppeVar1 = (this->example_copies)._end;
    for (ppeVar3 = (this->example_copies)._begin; ppeVar3 != ppeVar1; ppeVar3 = ppeVar3 + 1) {
      if ((*ppeVar3)->in_use == true) {
        VW::finish_example(this->vw_par_ref,*ppeVar3);
      }
    }
    v_array<example_*>::clear(&this->example_copies);
    return;
  }
  return;
}

Assistant:

void finish()
  {
    static example* empty_example = is_multiline ? VW::read_example(*vw_par_ref, (char*)"") : nullptr;
    if (is_multiline)
    {
      vw_ref->learn(*empty_example);
      for (auto ecc : example_copies)
        if (ecc->in_use)
          VW::finish_example(*vw_par_ref, *ecc);
      example_copies.clear();
    }
  }